

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O3

rt_vector_expr<viennamath::rt_expression_interface<double>_> *
viennamath::operator*
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *__return_storage_ptr__,
          rt_vector_expr<viennamath::rt_expression_interface<double>_> *lhs,
          rt_variable<viennamath::rt_expression_interface<double>_> *rhs)

{
  rt_expression_interface<double> *prVar1;
  int iVar2;
  int iVar3;
  pointer prVar4;
  undefined4 extraout_var;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int __flags;
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  *pvVar6;
  void *__child_stack;
  __fn *__fn;
  void *in_R8;
  undefined1 *puVar7;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_50;
  
  __fn = (__fn *)((long)(lhs->
                        super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ).
                        super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(lhs->
                        super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ).
                        super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
  rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            (__return_storage_ptr__,(size_type)__fn);
  prVar4 = (lhs->
           super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ).
           super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((lhs->
      super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      ).
      super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != prVar4) {
    puVar7 = (undefined1 *)0x0;
    pvVar6 = &__return_storage_ptr__->
              super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
    ;
    do {
      __flags = (int)pvVar6;
      iVar2 = (*(prVar4[(long)puVar7].rt_expr_._M_ptr)->_vptr_rt_expression_interface[2])();
      poVar5 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
      poVar5->_vptr_op_interface = (_func_int **)&PTR__op_interface_00116b20;
      iVar3 = (*(rhs->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(rhs);
      local_50.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar3);
      local_50.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_binary_expr_00116490;
      prVar4 = (__return_storage_ptr__->
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ).
               super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_50.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
      local_50.op_._M_ptr = poVar5;
      iVar2 = rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                        (&local_50,__fn,__child_stack,__flags,in_R8);
      prVar1 = prVar4[(long)puVar7].rt_expr_._M_ptr;
      if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar2)) {
        if (prVar1 != (rt_expression_interface<double> *)0x0) {
          (*prVar1->_vptr_rt_expression_interface[1])();
        }
        prVar4[(long)puVar7].rt_expr_._M_ptr =
             (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar2);
      }
      local_50.super_rt_expression_interface<double>._vptr_rt_expression_interface =
           (_func_int **)&PTR__rt_binary_expr_00116490;
      if (local_50.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_50.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      if (local_50.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0)
      {
        (*(local_50.op_._M_ptr)->_vptr_op_interface[1])();
      }
      if (local_50.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
        (*(local_50.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
      }
      puVar7 = puVar7 + 1;
      prVar4 = (lhs->
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ).
               super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                *)((long)(lhs->
                         super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ).
                         super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)prVar4 >> 3);
    } while (puVar7 < pvVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

rt_vector_expr<InterfaceType> operator*(rt_vector_expr<InterfaceType> const & lhs, T const & rhs)
  {
    rt_vector_expr<InterfaceType> result(lhs.size());
    for (std::size_t i=0; i<lhs.size(); ++i)
      result[i] = lhs[i] * rhs;

    return result;
  }